

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.cc
# Opt level: O0

size_type __thiscall re2::StringPiece::find(StringPiece *this,StringPiece *s,size_type pos)

{
  char *pcVar1;
  StringPiece *local_48;
  size_type xpos;
  char *result;
  size_type pos_local;
  StringPiece *s_local;
  StringPiece *this_local;
  
  if ((this->length_ < 0) || ((ulong)(long)this->length_ < pos)) {
    this_local = (StringPiece *)0xffffffffffffffff;
  }
  else {
    pcVar1 = std::search<char_const*,char_const*>
                       (this->ptr_ + pos,this->ptr_ + this->length_,s->ptr_,s->ptr_ + s->length_);
    local_48 = (StringPiece *)(pcVar1 + -(long)this->ptr_);
    if ((char *)(long)this->length_ < (char *)((long)&local_48->ptr_ + (long)s->length_)) {
      local_48 = (StringPiece *)0xffffffffffffffff;
    }
    this_local = local_48;
  }
  return (size_type)this_local;
}

Assistant:

StringPiece::size_type StringPiece::find(const StringPiece& s,
                                         size_type pos) const {
  if (length_ < 0 || pos > static_cast<size_type>(length_))
    return npos;

  const char* result = std::search(ptr_ + pos, ptr_ + length_,
                                   s.ptr_, s.ptr_ + s.length_);
  const size_type xpos = result - ptr_;
  return xpos + s.length_ <= static_cast<size_type>(length_) ? xpos : npos;
}